

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

int __thiscall Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  long *plVar3;
  undefined4 in_register_0000000c;
  long *plVar4;
  undefined4 in_register_00000034;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (0 < this->kMaxTimeout) {
    iVar1 = ::connect(this->forwarding_socket_,(sockaddr *)this->serveraddr_,0x10);
    this->connected = true;
    return iVar1;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception
                      (0x10,CONCAT44(in_register_00000034,__fd),__addr,
                       CONCAT44(in_register_0000000c,__len));
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"connect: ","");
  piVar2 = __errno_location();
  strerror(*piVar2);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  local_68 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connection::connect() {
    int ret;
    for (int numsec = 1; numsec <= kMaxTimeout; numsec *= 2) {
        ret = ::connect(forwarding_socket_, reinterpret_cast<sockaddr *> (serveraddr_), sizeof(*serveraddr_));
        connected = true;
        return;
    }
    throw std::runtime_error(std::string("connect: ") + strerror(errno));
}